

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O2

RNGState * anon_unknown.dwarf_1a8db9::GetRNGState(void)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  LockedPool *this;
  pointer pRVar5;
  undefined8 *puVar6;
  RNGState *__cur;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((anonymous_namespace)::GetRNGState()::g_rng == '\0') &&
     (iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::GetRNGState()::g_rng), iVar4 != 0)) {
    GetRNGState::g_rng.
    super__Vector_base<(anonymous_namespace)::RNGState,_secure_allocator<(anonymous_namespace)::RNGState>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    GetRNGState::g_rng.
    super__Vector_base<(anonymous_namespace)::RNGState,_secure_allocator<(anonymous_namespace)::RNGState>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    GetRNGState::g_rng.
    super__Vector_base<(anonymous_namespace)::RNGState,_secure_allocator<(anonymous_namespace)::RNGState>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this = &LockedPoolManager::Instance()->super_LockedPool;
    pRVar5 = (pointer)LockedPool::alloc(this,0x160);
    if (pRVar5 == (pointer)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar6 = clock_gettime;
        __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      goto LAB_0015e133;
    }
    GetRNGState::g_rng.
    super__Vector_base<(anonymous_namespace)::RNGState,_secure_allocator<(anonymous_namespace)::RNGState>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pRVar5 + 1;
    bVar3 = true;
    GetRNGState::g_rng.
    super__Vector_base<(anonymous_namespace)::RNGState,_secure_allocator<(anonymous_namespace)::RNGState>_>
    ._M_impl.super__Vector_impl_data._M_start = pRVar5;
    GetRNGState::g_rng.
    super__Vector_base<(anonymous_namespace)::RNGState,_secure_allocator<(anonymous_namespace)::RNGState>_>
    ._M_impl.super__Vector_impl_data._M_finish = pRVar5;
    while (bVar3) {
      (pRVar5->m_deterministic_prng).super__Optional_base<ChaCha20,_false,_false>._M_payload.
      super__Optional_payload<ChaCha20,_true,_false,_false>.super__Optional_payload_base<ChaCha20>.
      _M_engaged = false;
      (pRVar5->m_events_mutex).super_mutex.super___mutex_base._M_mutex.__align = 0;
      *(undefined8 *)((long)&(pRVar5->m_events_mutex).super_mutex.super___mutex_base._M_mutex + 8) =
           0;
      (pRVar5->m_events_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
           (__pthread_internal_list *)0x0;
      *(undefined8 *)
       ((long)&(pRVar5->m_events_mutex).super_mutex.super___mutex_base._M_mutex + 0x10) = 0;
      (pRVar5->m_events_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
           (__pthread_internal_list *)0x0;
      (pRVar5->m_mutex).super_mutex.super___mutex_base._M_mutex.__align = 0;
      *(undefined8 *)((long)&(pRVar5->m_mutex).super_mutex.super___mutex_base._M_mutex + 8) = 0;
      *(undefined8 *)((long)&(pRVar5->m_mutex).super_mutex.super___mutex_base._M_mutex + 0x10) = 0;
      (pRVar5->m_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
           (__pthread_internal_list *)0x0;
      (pRVar5->m_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
           (__pthread_internal_list *)0x0;
      pRVar5->m_state[0] = '\0';
      pRVar5->m_state[1] = '\0';
      pRVar5->m_state[2] = '\0';
      pRVar5->m_state[3] = '\0';
      pRVar5->m_state[4] = '\0';
      pRVar5->m_state[5] = '\0';
      pRVar5->m_state[6] = '\0';
      pRVar5->m_state[7] = '\0';
      pRVar5->m_state[8] = '\0';
      pRVar5->m_state[9] = '\0';
      pRVar5->m_state[10] = '\0';
      pRVar5->m_state[0xb] = '\0';
      pRVar5->m_state[0xc] = '\0';
      pRVar5->m_state[0xd] = '\0';
      pRVar5->m_state[0xe] = '\0';
      pRVar5->m_state[0xf] = '\0';
      pRVar5->m_state[0x10] = '\0';
      pRVar5->m_state[0x11] = '\0';
      pRVar5->m_state[0x12] = '\0';
      pRVar5->m_state[0x13] = '\0';
      pRVar5->m_state[0x14] = '\0';
      pRVar5->m_state[0x15] = '\0';
      pRVar5->m_state[0x16] = '\0';
      pRVar5->m_state[0x17] = '\0';
      pRVar5->m_state[0x18] = '\0';
      pRVar5->m_state[0x19] = '\0';
      pRVar5->m_state[0x1a] = '\0';
      pRVar5->m_state[0x1b] = '\0';
      pRVar5->m_state[0x1c] = '\0';
      pRVar5->m_state[0x1d] = '\0';
      pRVar5->m_state[0x1e] = '\0';
      pRVar5->m_state[0x1f] = '\0';
      pRVar5->m_counter = 0;
      pRVar5->m_strongly_seeded = false;
      CSHA256::CSHA256(&pRVar5->m_events_hasher);
      lVar2 = cpuid_Version_info(1);
      if ((*(uint *)(lVar2 + 0xc) >> 0x1e & 1) != 0) {
        (anonymous_namespace)::g_rdrand_supported = 1;
      }
      lVar2 = cpuid_Extended_Feature_Enumeration_info(7);
      if ((*(uint *)(lVar2 + 4) >> 0x12 & 1) != 0) {
        (anonymous_namespace)::g_rdseed_supported = 1;
      }
      pRVar5 = pRVar5 + 1;
      bVar3 = false;
    }
    GetRNGState::g_rng.
    super__Vector_base<(anonymous_namespace)::RNGState,_secure_allocator<(anonymous_namespace)::RNGState>_>
    ._M_impl.super__Vector_impl_data._M_finish = pRVar5;
    __cxa_atexit(std::
                 vector<(anonymous_namespace)::RNGState,_secure_allocator<(anonymous_namespace)::RNGState>_>
                 ::~vector,&GetRNGState::g_rng,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::GetRNGState()::g_rng);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return GetRNGState::g_rng.
           super__Vector_base<(anonymous_namespace)::RNGState,_secure_allocator<(anonymous_namespace)::RNGState>_>
           ._M_impl.super__Vector_impl_data._M_start;
  }
LAB_0015e133:
  __stack_chk_fail();
}

Assistant:

RNGState& GetRNGState() noexcept
{
    // This idiom relies on the guarantee that static variable are initialized
    // on first call, even when multiple parallel calls are permitted.
    static std::vector<RNGState, secure_allocator<RNGState>> g_rng(1);
    return g_rng[0];
}